

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int breplace(bstring b1,int pos,int len,bstring b2,uchar fill)

{
  int iVar1;
  bstring b;
  long lVar2;
  int iVar3;
  
  iVar1 = -1;
  if ((len | pos) < 0) {
    return -1;
  }
  if (b2 == (bstring)0x0 || b1 == (bstring)0x0) {
    return -1;
  }
  if (b1->data == (uchar *)0x0) {
    return -1;
  }
  if (b2->data == (uchar *)0x0) {
    return -1;
  }
  iVar3 = b1->slen;
  if ((long)iVar3 < 0) {
    return -1;
  }
  if (b2->slen < 0) {
    return -1;
  }
  if (b1->mlen < 1 || b1->mlen < iVar3) {
    return -1;
  }
  if (len + pos < iVar3) {
    lVar2 = (long)b2->data - (long)b1->data;
    b = b2;
    if ((lVar2 < iVar3 && -1 < lVar2) && (b = bstrcpy(b2), b == (bstring)0x0)) {
      return -1;
    }
    iVar3 = b->slen - len;
    if ((iVar3 == 0 || b->slen < len) || (iVar3 = balloc(b1,iVar3 + b1->slen), iVar3 == 0)) {
      if (b->slen != len) {
        memmove(b1->data + (long)b->slen + (ulong)(uint)pos,
                b1->data + (ulong)(uint)len + (ulong)(uint)pos,(long)b1->slen - (long)(len + pos));
      }
      memcpy(b1->data + (uint)pos,b->data,(long)b->slen);
      lVar2 = (long)b1->slen + ((long)b->slen - (long)len);
      b1->slen = (int)lVar2;
      b1->data[lVar2] = '\0';
      iVar1 = 0;
    }
    if (b != b2) {
      bdestroy(b);
    }
    return iVar1;
  }
  iVar1 = bsetstr(b1,pos,b2,fill);
  if (iVar1 < 0) {
    return -1;
  }
  lVar2 = (long)pos + (long)b2->slen;
  iVar1 = (int)lVar2;
  if (b1->slen <= iVar1) {
    return 0;
  }
  b1->slen = iVar1;
  b1->data[lVar2] = '\0';
  return 0;
}

Assistant:

int breplace (bstring b1, int pos, int len, const bstring b2, 
			  unsigned char fill) {
int pl, ret;
ptrdiff_t pd;
bstring aux = b2;

	if (pos < 0 || len < 0 || (pl = pos + len) < 0 || b1 == NULL || 
	    b2 == NULL || b1->data == NULL || b2->data == NULL || 
	    b1->slen < 0 || b2->slen < 0 || b1->mlen < b1->slen ||
	    b1->mlen <= 0) return BSTR_ERR;

	/* Straddles the end? */
	if (pl >= b1->slen) {
		if ((ret = bsetstr (b1, pos, b2, fill)) < 0) return ret;
		if (pos + b2->slen < b1->slen) {
			b1->slen = pos + b2->slen;
			b1->data[b1->slen] = (unsigned char) '\0';
		}
		return ret;
	}

	/* Aliasing case */
	if ((pd = (ptrdiff_t) (b2->data - b1->data)) >= 0 && pd < (ptrdiff_t) b1->slen) {
		if (NULL == (aux = bstrcpy (b2))) return BSTR_ERR;
	}

	if (aux->slen > len) {
		if (balloc (b1, b1->slen + aux->slen - len) != BSTR_OK) {
			if (aux != b2) bdestroy (aux);
			return BSTR_ERR;
		}
	}

	if (aux->slen != len) bstr__memmove (b1->data + pos + aux->slen, b1->data + pos + len, b1->slen - (pos + len));
	bstr__memcpy (b1->data + pos, aux->data, aux->slen);
	b1->slen += aux->slen - len;
	b1->data[b1->slen] = (unsigned char) '\0';
	if (aux != b2) bdestroy (aux);
	return BSTR_OK;
}